

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O0

int __thiscall H264StreamReader::processSPS(H264StreamReader *this,uint8_t *buff)

{
  bool bVar1;
  SPSUnit *pSVar2;
  ostream *poVar3;
  mapped_type *ppSVar4;
  double local_b0;
  double sarAR;
  string local_98;
  _Self local_78;
  _Self local_70;
  int local_68;
  int local_64;
  int nalRez;
  int oldSpsLen;
  uint8_t *nextNal;
  SPSUnit *local_48;
  SPSUnit *sps;
  uint local_34;
  _Self local_30;
  uint local_24;
  uint8_t *puStack_20;
  int seq_parameter_set_id;
  uint8_t *buff_local;
  H264StreamReader *this_local;
  
  puStack_20 = buff;
  buff_local = (uint8_t *)this;
  bVar1 = replaceToOwnSPS(this);
  if (bVar1) {
    if ((long)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd - (long)puStack_20
        < 8) {
      return -10;
    }
    local_34 = NALUnit::extractUEGolombCode
                         (puStack_20 + 4,
                          (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
    local_24 = local_34;
    local_30._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                   (&this->updatedSPSList,&local_34);
    sps = (SPSUnit *)
          std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                    (&this->updatedSPSList);
    bVar1 = std::operator!=(&local_30,(_Self *)&sps);
    if (bVar1) {
      return 0;
    }
  }
  pSVar2 = (SPSUnit *)operator_new(0x200);
  SPSUnit::SPSUnit(pSVar2);
  local_48 = pSVar2;
  _nalRez = NALUnit::findNALWithStartCode
                      (puStack_20,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd
                       ,true);
  local_64 = (int)_nalRez - (int)puStack_20;
  NALUnit::decodeBuffer(&local_48->super_NALUnit,puStack_20,_nalRez);
  local_68 = SPSUnit::deserialize(local_48);
  if (((this->orig_hrd_parameters_present_flag & 1U) != ((local_48->nalHrdParams).isPresent & 1U))
     || ((this->orig_vcl_parameters_present_flag & 1U) != ((local_48->vclHrdParams).isPresent & 1U))
     ) {
    this->orig_hrd_parameters_present_flag = (bool)((local_48->nalHrdParams).isPresent & 1);
    this->orig_vcl_parameters_present_flag = (bool)((local_48->vclHrdParams).isPresent & 1);
    if ((this->m_spsChangeWarned & 1U) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "H264 warn: SPS parameters is not consistent throughout a stream");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      sLastMsg = true;
      this->m_spsChangeWarned = true;
    }
  }
  pSVar2 = local_48;
  if (local_68 == 0) {
    local_70._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
         ::find(&this->m_spsMap,&local_48->seq_parameter_set_id);
    local_78._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
         ::end(&this->m_spsMap);
    bVar1 = std::operator==(&local_70,&local_78);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Decoding H264 stream (track ");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,(this->super_MPEGStreamReader).super_AbstractStreamReader.
                                 m_streamIndex);
      poVar3 = std::operator<<(poVar3,"): ");
      SPSUnit::getStreamDescr_abi_cxx11_(&local_98,local_48);
      poVar3 = std::operator<<(poVar3,(string *)&local_98);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_98);
      sLastMsg = true;
      if (this->m_forcedLevel != '\0') {
        poVar3 = std::operator<<((ostream *)&std::cout,"Change H264 level from ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)local_48->level_idc / 10.0);
        poVar3 = std::operator<<(poVar3," to ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)this->m_forcedLevel / 10.0);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      sLastMsg = true;
    }
    if ((this->m_forcedLevel != '\0') &&
       (3 < (long)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd -
            (long)puStack_20)) {
      puStack_20[3] = this->m_forcedLevel;
      (local_48->super_NALUnit).m_nalBuffer[3] = this->m_forcedLevel;
      local_48->level_idc = (uint)this->m_forcedLevel;
    }
    MPEGStreamReader::updateFPS(&this->super_MPEGStreamReader,local_48,puStack_20,_nalRez,local_64);
    updateHRDParam(this,local_48);
    if (((local_48->nalHrdParams).isPresent & 1U) != 0) {
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                (&this->updatedSPSList,&local_48->seq_parameter_set_id);
    }
    ppSVar4 = std::
              map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
              ::operator[](&this->m_spsMap,&local_48->seq_parameter_set_id);
    pSVar2 = *ppSVar4;
    if (pSVar2 != (SPSUnit *)0x0) {
      SPSUnit::~SPSUnit(pSVar2);
      operator_delete(pSVar2,0x200);
    }
    pSVar2 = local_48;
    ppSVar4 = std::
              map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
              ::operator[](&this->m_spsMap,&local_48->seq_parameter_set_id);
    *ppSVar4 = pSVar2;
    local_b0 = 1.0;
    if (local_48->aspect_ratio_info_present_flag != 0) {
      if ((local_48->aspect_ratio_idc == '\0') || (0x10 < local_48->aspect_ratio_idc)) {
        if (local_48->aspect_ratio_idc == 0xff) {
          local_b0 = (double)local_48->sar_width / (double)local_48->sar_height;
        }
      }
      else {
        local_b0 = h264_ar_coeff[local_48->aspect_ratio_idc];
      }
    }
    MPEGStreamReader::fillAspectBySAR(&this->super_MPEGStreamReader,local_b0);
    this_local._4_4_ = 0;
  }
  else {
    if (local_48 != (SPSUnit *)0x0) {
      SPSUnit::~SPSUnit(local_48);
      operator_delete(pSVar2,0x200);
    }
    this_local._4_4_ = local_68;
  }
  return this_local._4_4_;
}

Assistant:

int H264StreamReader::processSPS(uint8_t *buff)
{
    if (replaceToOwnSPS())
    {
        // do not updat SPS in stream because of we are going to insert own sps
        if (m_bufEnd - buff < 8)
            return NOT_ENOUGH_BUFFER;
        const int seq_parameter_set_id = static_cast<int>(NALUnit::extractUEGolombCode(buff + 4, m_bufEnd));
        if (updatedSPSList.find(seq_parameter_set_id) != updatedSPSList.end())
            return 0;  // already processed
    }

    auto *sps = new SPSUnit();
    uint8_t *nextNal = NALUnit::findNALWithStartCode(buff, m_bufEnd, true);
    const int oldSpsLen = static_cast<int>(nextNal - buff);
    sps->decodeBuffer(buff, nextNal);
    const int nalRez = sps->deserialize();

    if (orig_hrd_parameters_present_flag != sps->nalHrdParams.isPresent ||
        orig_vcl_parameters_present_flag != sps->vclHrdParams.isPresent)
    {
        orig_hrd_parameters_present_flag = sps->nalHrdParams.isPresent;
        orig_vcl_parameters_present_flag = sps->vclHrdParams.isPresent;
        if (!m_spsChangeWarned)
        {
            LTRACE(LT_WARN, 2, "H264 warn: SPS parameters is not consistent throughout a stream");
            m_spsChangeWarned = true;
        }
    }

    // long sps fields can cause 00 00 0x code and it is required decode slice header
    if (nalRez != 0)
    {
        delete sps;
        return nalRez;  // not enough buffer
    }

    if (m_spsMap.find(sps->seq_parameter_set_id) == m_spsMap.end())
    {
        LTRACE(LT_INFO, 2, "Decoding H264 stream (track " << m_streamIndex << "): " << sps->getStreamDescr());
        if (m_forcedLevel != 0)
            LTRACE(LT_INFO, 2, "Change H264 level from " << sps->level_idc / 10.0 << " to " << m_forcedLevel / 10.0);
    }
    // update profile if needed
    if (m_forcedLevel != 0 && m_bufEnd - buff >= 4)
    {
        buff[3] = m_forcedLevel;
        sps->m_nalBuffer[3] = m_forcedLevel;
        sps->level_idc = m_forcedLevel;
    }

    updateFPS(sps, buff, nextNal, oldSpsLen);
    updateHRDParam(sps);
    if (sps->nalHrdParams.isPresent)
        updatedSPSList.insert(sps->seq_parameter_set_id);

    delete m_spsMap[sps->seq_parameter_set_id];
    m_spsMap[sps->seq_parameter_set_id] = sps;

    double sarAR = 1.0;
    if (sps->aspect_ratio_info_present_flag)
    {
        if (sps->aspect_ratio_idc >= 1 && sps->aspect_ratio_idc <= 16)
            sarAR = h264_ar_coeff[sps->aspect_ratio_idc];
        else if (sps->aspect_ratio_idc == Extended_SAR)
            sarAR = sps->sar_width / static_cast<double>(sps->sar_height);
    }
    fillAspectBySAR(sarAR);

    return 0;
}